

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall cmCTestLaunch::RunChild(cmCTestLaunch *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int64_t iVar1;
  undefined4 uVar2;
  undefined3 uVar3;
  StdioConfiguration SVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  cmUVProcessChainBuilder *pcVar8;
  uv_loop_t *loop;
  Status *pSVar9;
  int iVar10;
  bool errFinished;
  bool outFinished;
  cmProcessOutput processOutput;
  cmUVProcessChain chain;
  StdioType local_4e0;
  int iStack_4dc;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> errorHandle;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> outputHandle;
  uv_pipe_ptr errPipe;
  uv_pipe_ptr outPipe;
  anon_class_16_2_57ddfa98 beginRead;
  cmUVProcessChainBuilder builder;
  ofstream ferr;
  ofstream fout;
  
  __lhs = (this->RealArgs).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if ((__lhs != (this->RealArgs).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) &&
     (bVar6 = std::operator==(__lhs,":"), !bVar6)) {
    cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
    cmUVProcessChainBuilder::AddCommand(&builder,&this->RealArgV);
    std::ofstream::ofstream(&fout);
    std::ofstream::ofstream(&ferr);
    if ((this->Reporter).Passthru == true) {
      pcVar8 = cmUVProcessChainBuilder::SetExternalStream(&builder,Stream_OUTPUT,_stdout);
      cmUVProcessChainBuilder::SetExternalStream(pcVar8,Stream_ERROR,_stderr);
    }
    else {
      pcVar8 = cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
      cmUVProcessChainBuilder::SetBuiltinStream(pcVar8,Stream_ERROR);
      std::ofstream::open((char *)&fout,(_Ios_Openmode)(this->Reporter).LogOut._M_dataplus._M_p);
      std::ofstream::open((char *)&ferr,(_Ios_Openmode)(this->Reporter).LogErr._M_dataplus._M_p);
    }
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&chain);
    outPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    outPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    errPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    errPipe.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
    super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    outFinished = true;
    errFinished = true;
    iVar10 = 1;
    cmProcessOutput::cmProcessOutput(&processOutput,Auto,0x400);
    outputHandle._M_t.
    super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t.
    super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
    super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
          )(__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)0x0;
    errorHandle._M_t.
    super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>._M_t.
    super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
    super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>,_true,_true>
          )(__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)0x0;
    if ((this->Reporter).Passthru != true) {
      beginRead.chain = &chain;
      beginRead.processOutput = &processOutput;
      uVar7 = cmUVProcessChain::OutputStream(&chain);
      RunChild::anon_class_16_2_57ddfa98::operator()
                ((anon_class_16_2_57ddfa98 *)&stack0xfffffffffffffb20,(uv_pipe_ptr *)&beginRead,
                 (int)&outPipe,(ostream *)(ulong)uVar7,(ofstream *)&std::cout,(bool *)&fout,
                 &this->HaveOut,(int)&outFinished);
      SVar4 = _local_4e0;
      local_4e0 = None;
      iStack_4dc = 0;
      std::__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::reset
                ((__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                  *)&outputHandle,(pointer)SVar4);
      std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
                ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                 &stack0xfffffffffffffb20);
      uVar7 = cmUVProcessChain::ErrorStream(&chain);
      RunChild::anon_class_16_2_57ddfa98::operator()
                ((anon_class_16_2_57ddfa98 *)&stack0xfffffffffffffb20,(uv_pipe_ptr *)&beginRead,
                 (int)&errPipe,(ostream *)(ulong)uVar7,(ofstream *)&std::cerr,(bool *)&ferr,
                 &this->HaveErr,(int)&errFinished);
      SVar4 = _local_4e0;
      local_4e0 = None;
      iStack_4dc = 0;
      std::__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::reset
                ((__uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
                  *)&errorHandle,(pointer)SVar4);
      std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
                ((unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> *)
                 &stack0xfffffffffffffb20);
    }
    while (((bVar6 = cmUVProcessChain::Finished(&chain), !bVar6 || (outFinished != true)) ||
           ((errFinished & 1U) == 0))) {
      loop = cmUVProcessChain::GetLoop(&chain);
      uv_run(loop,UV_RUN_ONCE);
    }
    pSVar9 = cmUVProcessChain::GetStatus(&chain,0);
    uVar2 = *(undefined4 *)&pSVar9->field_0x14;
    (this->Reporter).Status.TermSignal = pSVar9->TermSignal;
    *(undefined4 *)&(this->Reporter).Status.field_0x14 = uVar2;
    bVar6 = pSVar9->Finished;
    uVar3 = *(undefined3 *)&pSVar9->field_0x5;
    iVar1 = pSVar9->ExitStatus;
    (this->Reporter).Status.SpawnResult = pSVar9->SpawnResult;
    (this->Reporter).Status.Finished = bVar6;
    *(undefined3 *)&(this->Reporter).Status.field_0x5 = uVar3;
    (this->Reporter).Status.ExitStatus = iVar1;
    cmUVProcessChain::Status::GetException_abi_cxx11_
              ((pair<cmUVProcessChain::ExceptionCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&beginRead,&(this->Reporter).Status);
    iVar5 = (int)beginRead.chain;
    std::__cxx11::string::~string((string *)&beginRead.processOutput);
    if (iVar5 != 5) {
      iVar10 = (int)(this->Reporter).Status.ExitStatus;
    }
    (this->Reporter).ExitCode = iVar10;
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              (&errorHandle);
    std::unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>::~unique_ptr
              (&outputHandle);
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_pipe_s> *)&errPipe);
    ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_pipe_s> *)&outPipe);
    cmUVProcessChain::~cmUVProcessChain(&chain);
    std::ofstream::~ofstream(&ferr);
    std::ofstream::~ofstream(&fout);
    cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&builder);
    return;
  }
  (this->Reporter).ExitCode = 0;
  return;
}

Assistant:

void cmCTestLaunch::RunChild()
{
  // Ignore noopt make rules
  if (this->RealArgs.empty() || this->RealArgs[0] == ":") {
    this->Reporter.ExitCode = 0;
    return;
  }

  // Prepare to run the real command.
  cmUVProcessChainBuilder builder;
  builder.AddCommand(this->RealArgV);

  cmsys::ofstream fout;
  cmsys::ofstream ferr;
  if (this->Reporter.Passthru) {
    // In passthru mode we just share the output pipes.
    builder.SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, stdout)
      .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, stderr);
  } else {
    // In full mode we record the child output pipes to log files.
    builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
      .SetBuiltinStream(cmUVProcessChainBuilder::Stream_ERROR);
    fout.open(this->Reporter.LogOut.c_str(), std::ios::out | std::ios::binary);
    ferr.open(this->Reporter.LogErr.c_str(), std::ios::out | std::ios::binary);
  }

#ifdef _WIN32
  // Do this so that newline transformation is not done when writing to cout
  // and cerr below.
  _setmode(fileno(stdout), _O_BINARY);
  _setmode(fileno(stderr), _O_BINARY);
#endif

  // Run the real command.
  auto chain = builder.Start();

  // Record child stdout and stderr if necessary.
  cm::uv_pipe_ptr outPipe;
  cm::uv_pipe_ptr errPipe;
  bool outFinished = true;
  bool errFinished = true;
  cmProcessOutput processOutput;
  std::unique_ptr<cmUVStreamReadHandle> outputHandle;
  std::unique_ptr<cmUVStreamReadHandle> errorHandle;
  if (!this->Reporter.Passthru) {
    auto beginRead = [&chain, &processOutput](
                       cm::uv_pipe_ptr& pipe, int stream, std::ostream& out,
                       cmsys::ofstream& file, bool& haveData, bool& finished,
                       int id) -> std::unique_ptr<cmUVStreamReadHandle> {
      pipe.init(chain.GetLoop(), 0);
      uv_pipe_open(pipe, stream);
      finished = false;
      return cmUVStreamRead(
        pipe,
        [&processOutput, &out, &file, id, &haveData](std::vector<char> data) {
          std::string strdata;
          processOutput.DecodeText(data.data(), data.size(), strdata, id);
          file.write(strdata.c_str(), strdata.size());
          out.write(strdata.c_str(), strdata.size());
          haveData = true;
        },
        [&processOutput, &out, &file, &finished, id]() {
          std::string strdata;
          processOutput.DecodeText(std::string(), strdata, id);
          if (!strdata.empty()) {
            file.write(strdata.c_str(), strdata.size());
            out.write(strdata.c_str(), strdata.size());
          }
          finished = true;
        });
    };
    outputHandle = beginRead(outPipe, chain.OutputStream(), std::cout, fout,
                             this->HaveOut, outFinished, 1);
    errorHandle = beginRead(errPipe, chain.ErrorStream(), std::cerr, ferr,
                            this->HaveErr, errFinished, 2);
  }

  // Wait for the real command to finish.
  while (!(chain.Finished() && outFinished && errFinished)) {
    uv_run(&chain.GetLoop(), UV_RUN_ONCE);
  }
  this->Reporter.Status = chain.GetStatus(0);
  if (this->Reporter.Status.GetException().first ==
      cmUVProcessChain::ExceptionCode::Spawn) {
    this->Reporter.ExitCode = 1;
  } else {
    this->Reporter.ExitCode =
      static_cast<int>(this->Reporter.Status.ExitStatus);
  }
}